

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

void __thiscall const::$_0::operator()(wasm::Type)::HeapType__(void *this,HeapType *heapType)

{
  Type TVar1;
  bool bVar2;
  BasicHeapType BVar3;
  FeatureSet FVar4;
  RecGroup RVar5;
  undefined1 auVar6 [8];
  optional<wasm::HeapType> oVar7;
  undefined1 local_48 [8];
  Signature sig;
  Type local_30;
  Type child;
  
  if (heapType->id < 0xe) {
    BVar3 = ::wasm::HeapType::getBasic(heapType);
    switch(BVar3) {
    case ext:
    case func:
    case none:
    case noext:
    case nofunc:
      *(byte *)((long)this + 0x55) = *(byte *)((long)this + 0x55) | 1;
      break;
    case any:
    case eq:
    case i31:
    case struct_:
    case array:
      *(byte *)((long)this + 0x55) = *(byte *)((long)this + 0x55) | 5;
      break;
    case string:
    case stringview_wtf8:
    case stringview_wtf16:
    case stringview_iter:
      *(byte *)((long)this + 0x55) = *(byte *)((long)this + 0x55) | 0x81;
      break;
    default:
      goto switchD_00a39296_default;
    }
  }
  else {
switchD_00a39296_default:
    bVar2 = ::wasm::HeapType::isStruct(heapType);
    if ((((bVar2) || (bVar2 = ::wasm::HeapType::isArray(heapType), bVar2)) ||
        ((RVar5 = ::wasm::HeapType::getRecGroup(heapType), (RVar5.id & 1) == 0 &&
         (8 < (ulong)(*(long *)(RVar5.id + 8) - *(long *)RVar5.id))))) ||
       (oVar7 = ::wasm::HeapType::getSuperType(heapType),
       ((undefined1  [16])
        oVar7.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
       (undefined1  [16])0x0)) {
      *(byte *)((long)this + 0x55) = *(byte *)((long)this + 0x55) | 5;
    }
    else {
      bVar2 = ::wasm::HeapType::isSignature(heapType);
      if (bVar2) {
        *(byte *)((long)this + 0x55) = *(byte *)((long)this + 0x55) | 1;
        _local_48 = ::wasm::HeapType::getSignature(heapType);
        bVar2 = ::wasm::Type::isTuple(&sig.params);
        if (bVar2) {
          *(byte *)((long)this + 0x55) = *(byte *)((long)this + 0x55) | 2;
        }
      }
    }
    ::wasm::HeapType::getTypeChildren
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_48,heapType);
    TVar1.id = sig.params.id;
    for (auVar6 = local_48; auVar6 != (undefined1  [8])TVar1.id;
        auVar6 = (undefined1  [8])((long)auVar6 + 8)) {
      local_30.id = *(uintptr_t *)auVar6;
      bVar2 = ::wasm::Type::isRef(&local_30);
      if (!bVar2) {
        FVar4 = ::wasm::Type::getFeatures(&local_30);
        *(uint *)((long)this + 0x54) = *(uint *)((long)this + 0x54) | FVar4.features;
      }
    }
    std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
              ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)local_48);
  }
  return;
}

Assistant:

void noteChild(HeapType* heapType) {
          if (heapType->isBasic()) {
            switch (heapType->getBasic()) {
              case HeapType::ext:
              case HeapType::func:
                feats |= FeatureSet::ReferenceTypes;
                return;
              case HeapType::any:
              case HeapType::eq:
              case HeapType::i31:
              case HeapType::struct_:
              case HeapType::array:
                feats |= FeatureSet::ReferenceTypes | FeatureSet::GC;
                return;
              case HeapType::string:
              case HeapType::stringview_wtf8:
              case HeapType::stringview_wtf16:
              case HeapType::stringview_iter:
                feats |= FeatureSet::ReferenceTypes | FeatureSet::Strings;
                return;
              case HeapType::none:
              case HeapType::noext:
              case HeapType::nofunc:
                // Technically introduced in GC, but used internally as part of
                // ref.null with just reference types.
                feats |= FeatureSet::ReferenceTypes;
                return;
            }
          }

          if (heapType->isStruct() || heapType->isArray() ||
              heapType->getRecGroup().size() > 1 || heapType->getSuperType()) {
            feats |= FeatureSet::ReferenceTypes | FeatureSet::GC;
          } else if (heapType->isSignature()) {
            // This is a function reference, which requires reference types and
            // possibly also multivalue (if it has multiple returns). Note that
            // technically typed function references also require GC, however,
            // we use these types internally regardless of the presence of GC
            // (in particular, since during load of the wasm we don't know the
            // features yet, so we apply the more refined types), so we don't
            // add that in any case here.
            feats |= FeatureSet::ReferenceTypes;
            auto sig = heapType->getSignature();
            if (sig.results.isTuple()) {
              feats |= FeatureSet::Multivalue;
            }
          }

          // In addition, scan their non-ref children, to add dependencies on
          // things like SIMD.
          for (auto child : heapType->getTypeChildren()) {
            if (!child.isRef()) {
              feats |= child.getFeatures();
            }
          }
        }